

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

size_t ftxui::GlyphNext(string *input,size_t start)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  size_t sVar5;
  uint32_t codepoint;
  size_t end;
  uint32_t local_3c;
  size_t local_38;
  
  uVar1 = input->_M_string_length;
  sVar5 = uVar1;
  if (start < uVar1) {
    bVar4 = 0;
    do {
      local_38 = 0;
      local_3c = 0;
      bVar3 = EatCodePoint(input,start,&local_38,&local_3c);
      bVar2 = bVar4;
      if ((bVar3) && (local_3c != 0)) {
        if (local_3c < 0x20) {
          if (local_3c == 10) {
LAB_0010c8bd:
            bVar3 = IsCombining(local_3c);
            bVar2 = !bVar3 | bVar4;
            if ((!bVar3) && (sVar5 = start, !(bool)(bVar4 ^ 1))) break;
          }
        }
        else if (0x20 < local_3c - 0x7f) goto LAB_0010c8bd;
      }
      start = local_38;
      sVar5 = uVar1;
      bVar4 = bVar2;
    } while (local_38 < uVar1);
  }
  return (long)(int)sVar5;
}

Assistant:

size_t GlyphNext(const std::string& input, size_t start) {
  bool glyph_found = false;
  while (start < input.size()) {
    size_t end = 0;
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);

    // Ignore invalid, control characters and combining characters.
    if (!eaten || IsControl(codepoint) || IsCombining(codepoint)) {
      start = end;
      continue;
    }

    // We eat the beginning of the next glyph. If we are eating the one
    // requested, return its start position immediately.
    if (glyph_found) {
      return static_cast<int>(start);
    }

    // Otherwise, skip this glyph and iterate:
    glyph_found = true;
    start = end;
  }
  return static_cast<int>(input.size());
}